

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::CreateTar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,cmTarCompression compressType,bool verbose,string *mtime,string *format,
               int compressionLevel)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  Compress c;
  pointer pbVar4;
  allocator<char> local_399;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string cwd;
  string local_350;
  string local_330;
  cmArchiveWrite a;
  ofstream fout;
  byte abStack_210 [480];
  
  GetCurrentWorkingDirectory_abi_cxx11_();
  std::ofstream::ofstream(&fout,(outFileName->_M_dataplus)._M_p,_S_out|_S_bin);
  if ((abStack_210[*(long *)(_fout + -0x18)] & 5) == 0) {
    c = CompressNone;
    if (compressType < TarCompressNone) {
      c = *(Compress *)(&DAT_002200f0 + (ulong)compressType * 4);
    }
    if (format->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&path,"paxr",&local_399);
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)format);
    }
    cmArchiveWrite::cmArchiveWrite(&a,(ostream *)&fout,c,&path,compressionLevel,1);
    std::__cxx11::string::~string((string *)&path);
    bVar2 = cmArchiveWrite::Open(&a);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&a.MTime);
      pbVar1 = (files->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = true;
      a.Verbose = verbose;
      for (pbVar4 = (files->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1;
          pbVar4 = pbVar4 + 1) {
        std::__cxx11::string::string((string *)&path,(string *)pbVar4);
        bVar3 = cmsys::SystemTools::FileIsFullPath(&path);
        if (bVar3) {
          RelativePath(&local_330,&cwd,&path);
          std::__cxx11::string::operator=((string *)&path,(string *)&local_330);
          std::__cxx11::string::~string((string *)&local_330);
        }
        std::__cxx11::string::string((string *)&local_350,(string *)&path);
        bVar3 = cmArchiveWrite::Add(&a,&local_350,0,(char *)0x0,true);
        std::__cxx11::string::~string((string *)&local_350);
        if (!bVar3) {
          std::__cxx11::string::string((string *)&local_330,(string *)&a.Error);
          Error(&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&path);
      }
    }
    else {
      std::__cxx11::string::string((string *)&path,(string *)&a.Error);
      Error(&path);
      std::__cxx11::string::~string((string *)&path);
      bVar2 = false;
    }
    cmArchiveWrite::~cmArchiveWrite(&a);
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
              ((string *)&a,(char (*) [26])"Cannot open output file \"",outFileName,
               (char (*) [4])"\": ",&path);
    std::__cxx11::string::~string((string *)&path);
    Error((string *)&a);
    std::__cxx11::string::~string((string *)&a);
    bVar2 = false;
  }
  std::ofstream::~ofstream(&fout);
  std::__cxx11::string::~string((string *)&cwd);
  return bVar2;
}

Assistant:

bool cmSystemTools::CreateTar(const std::string& outFileName,
                              const std::vector<std::string>& files,
                              cmTarCompression compressType, bool verbose,
                              std::string const& mtime,
                              std::string const& format, int compressionLevel)
{
#if !defined(CMAKE_BOOTSTRAP)
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  cmsys::ofstream fout(outFileName.c_str(), std::ios::out | std::ios::binary);
  if (!fout) {
    std::string e = cmStrCat("Cannot open output file \"", outFileName,
                             "\": ", cmSystemTools::GetLastSystemError());
    cmSystemTools::Error(e);
    return false;
  }
  cmArchiveWrite::Compress compress = cmArchiveWrite::CompressNone;
  switch (compressType) {
    case TarCompressGZip:
      compress = cmArchiveWrite::CompressGZip;
      break;
    case TarCompressBZip2:
      compress = cmArchiveWrite::CompressBZip2;
      break;
    case TarCompressXZ:
      compress = cmArchiveWrite::CompressXZ;
      break;
    case TarCompressZstd:
      compress = cmArchiveWrite::CompressZstd;
      break;
    case TarCompressNone:
      compress = cmArchiveWrite::CompressNone;
      break;
  }

  cmArchiveWrite a(fout, compress, format.empty() ? "paxr" : format,
                   compressionLevel);

  if (!a.Open()) {
    cmSystemTools::Error(a.GetError());
    return false;
  }
  a.SetMTime(mtime);
  a.SetVerbose(verbose);
  bool tarCreatedSuccessfully = true;
  for (auto path : files) {
    if (cmSystemTools::FileIsFullPath(path)) {
      // Get the relative path to the file.
      path = cmSystemTools::RelativePath(cwd, path);
    }
    if (!a.Add(path)) {
      cmSystemTools::Error(a.GetError());
      tarCreatedSuccessfully = false;
    }
  }
  return tarCreatedSuccessfully;
#else
  (void)outFileName;
  (void)files;
  (void)verbose;
  return false;
#endif
}